

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O1

void ref_swap_tattle_nodes(REF_CELL ref_cell,REF_INT node0,REF_INT node1)

{
  REF_ADJ_ITEM pRVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int local_38;
  
  uVar6 = 0xffffffff;
  if (-1 < node0) {
    uVar6 = 0xffffffff;
    if (node0 < ref_cell->ref_adj->nnode) {
      uVar6 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node0];
    }
  }
  if ((int)uVar6 != -1) {
    uVar4 = ref_cell->ref_adj->item[(int)uVar6].ref;
    do {
      iVar2 = ref_cell->node_per;
      if (0 < iVar2) {
        iVar7 = 0;
        do {
          iVar5 = ref_cell->size_per * uVar4;
          if (ref_cell->c2n[iVar5 + iVar7] == node1) {
            printf("cell %d cell id %d\n",(ulong)uVar4,(ulong)(uint)ref_cell->c2n[iVar5 + iVar2]);
            iVar2 = ref_cell->node_per;
            if (0 < iVar2) {
              lVar3 = 0;
              do {
                printf(" %d",(ulong)(uint)ref_cell->c2n
                                          [(long)ref_cell->size_per * (long)(int)uVar4 + lVar3]);
                iVar2 = ref_cell->node_per;
                lVar3 = lVar3 + 1;
              } while ((int)lVar3 < iVar2);
            }
            printf(" %d\n",(ulong)(uint)ref_cell->c2n[(int)(ref_cell->size_per * uVar4 + iVar2)]);
          }
          iVar7 = iVar7 + 1;
          iVar2 = ref_cell->node_per;
        } while (iVar7 < iVar2);
      }
      pRVar1 = ref_cell->ref_adj->item;
      local_38 = (int)uVar6;
      iVar2 = pRVar1[local_38].next;
      uVar6 = (ulong)iVar2;
      if (uVar6 == 0xffffffffffffffff) {
        uVar4 = 0xffffffff;
      }
      else {
        uVar4 = pRVar1[uVar6].ref;
      }
    } while (iVar2 != -1);
  }
  return;
}

Assistant:

static void ref_swap_tattle_nodes(REF_CELL ref_cell, REF_INT node0,
                                  REF_INT node1) {
  REF_INT item, cell_node, cell, cell_node2;
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    printf("cell %d cell id %d\n", cell,
           ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell));
    each_ref_cell_cell_node(ref_cell, cell_node2) {
      printf(" %d", ref_cell_c2n(ref_cell, cell_node2, cell));
    }
    printf(" %d\n", ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell));
  }
}